

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  undefined1 auVar11 [16];
  unkbyte10 Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  int16_t iVar30;
  uint uVar31;
  undefined8 unaff_RBX;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  ushort uVar44;
  undefined4 uVar45;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined4 uVar46;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ushort uVar52;
  ushort uVar58;
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  short sVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined4 uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int16_t *local_1a0;
  short local_158;
  short sStack_156;
  undefined1 local_148 [16];
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  undefined1 local_f8 [16];
  ushort local_e8;
  ushort uStack_e6;
  undefined8 local_98;
  ulong uStack_90;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short sVar74;
  short sVar76;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse2_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse2_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse2_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse2_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse2_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse2_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar42 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse2_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar42 = (ulong)(uint)matrix->length;
    }
    iVar32 = -open;
    iVar27 = matrix->min;
    iVar18 = -iVar27;
    if (iVar27 != iVar32 && SBORROW4(iVar27,iVar32) == iVar27 + open < 0) {
      iVar18 = open;
    }
    iVar27 = matrix->max;
    uVar16 = (uint)uVar42;
    ppVar19 = parasail_result_new_table1(uVar16,s2Len);
    if (ppVar19 != (parasail_result_t *)0x0) {
      ppVar19->flag = ppVar19->flag | 0x8221001;
      uVar39 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar39);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar39);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar39);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar41 = uVar16 + 7;
          local_1a0 = parasail_memalign_int16_t(0x10,(long)iVar41);
          if (local_1a0 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar16) {
            piVar2 = matrix->mapper;
            uVar39 = 0;
            do {
              local_1a0[uVar39] = (int16_t)piVar2[(byte)_s1[uVar39]];
              uVar39 = uVar39 + 1;
            } while (uVar42 != uVar39);
          }
          iVar10 = uVar16 + 1;
          if ((int)(uVar16 + 1) < iVar41) {
            iVar10 = iVar41;
          }
          memset(local_1a0 + (int)uVar16,0,(ulong)(~uVar16 + iVar10) * 2 + 2);
        }
        else {
          local_1a0 = (int16_t *)0x0;
        }
        auVar47 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar27));
        uVar15 = s2Len + 7;
        uVar33 = uVar16 - 1;
        iVar27 = s2Len + -1;
        uVar38 = iVar18 - 0x7fff;
        auVar73 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
        uVar72 = auVar73._0_4_;
        local_158 = auVar73._0_2_;
        sStack_156 = auVar73._2_2_;
        auVar47 = pshuflw(auVar47,auVar47,0);
        auVar73._0_4_ = auVar47._0_4_;
        auVar73._4_4_ = auVar73._0_4_;
        auVar73._8_4_ = auVar73._0_4_;
        auVar73._12_4_ = auVar73._0_4_;
        auVar73 = pshuflw(auVar73,ZEXT416((uint)open),0);
        uVar45 = auVar73._0_4_;
        auVar73 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        auVar48._0_4_ = auVar73._0_4_;
        auVar48._4_4_ = auVar48._0_4_;
        auVar48._8_4_ = auVar48._0_4_;
        auVar48._12_4_ = auVar48._0_4_;
        auVar73 = psllw(auVar48,3);
        auVar49 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
        uVar46 = auVar49._0_4_;
        auVar59._4_4_ = uVar46;
        auVar59._0_4_ = uVar46;
        auVar59._8_4_ = uVar46;
        auVar59._12_4_ = uVar46;
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar59 = paddsw(auVar59,auVar49);
        auVar60 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        auVar60._4_4_ = auVar60._0_4_;
        auVar60._8_4_ = auVar60._0_4_;
        auVar60._12_4_ = auVar60._0_4_;
        auVar49 = paddsw(auVar60,auVar49);
        local_148._6_2_ = (short)(iVar32 + gap * -4);
        local_148._4_2_ = (short)(gap * 0xfffb - open);
        local_148._2_2_ = (short)(gap * 0xfffa - open);
        local_148._0_2_ = (short)(gap * 0xfff9 - open);
        local_148._10_2_ = (short)(iVar32 + gap * -2);
        local_148._8_2_ = (short)(gap * 0xfffd - open);
        sVar63 = (short)iVar32;
        local_148._14_2_ = sVar63;
        local_148._12_2_ = (short)(iVar32 - gap);
        piVar2 = matrix->mapper;
        uVar39 = 1;
        if (1 < s2Len) {
          uVar39 = (ulong)(uint)s2Len;
        }
        uVar28 = 0;
        do {
          ptr[uVar28 + 7] = (int16_t)piVar2[(byte)_s2[uVar28]];
          uVar28 = uVar28 + 1;
        } while (uVar39 != uVar28);
        uVar28 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar43 = (ulong)(uint)s2Len;
        uVar22 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar15) {
          uVar22 = uVar15;
        }
        memset(ptr + uVar43 + 7,0,(ulong)(~s2Len + uVar22) * 2 + 2);
        do {
          ptr_00[uVar28 + 7] = (int16_t)iVar32;
          iVar32 = iVar32 - gap;
          iVar30 = (int16_t)uVar38;
          ptr_01[uVar28 + 7] = iVar30;
          uVar28 = uVar28 + 1;
        } while (uVar39 != uVar28);
        lVar20 = 0;
        do {
          ptr_00[lVar20] = iVar30;
          ptr_01[lVar20] = iVar30;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 7);
        lVar20 = uVar43 + 7;
        do {
          ptr_00[lVar20] = iVar30;
          ptr_01[lVar20] = iVar30;
          lVar20 = lVar20 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar15);
        ptr_00[6] = 0;
        local_e8 = auVar47._0_2_;
        uStack_e6 = auVar47._2_2_;
        uVar64 = local_e8;
        uVar65 = uStack_e6;
        uVar66 = local_e8;
        uVar67 = uStack_e6;
        uVar68 = local_e8;
        uVar69 = uStack_e6;
        uVar70 = local_e8;
        uVar71 = uStack_e6;
        if ((int)uVar16 < 1) {
          auVar47._4_2_ = local_158;
          auVar47._0_4_ = uVar72;
          auVar47._6_2_ = sStack_156;
          auVar47._8_2_ = local_158;
          auVar47._10_2_ = sStack_156;
          auVar47._12_2_ = local_158;
          auVar47._14_2_ = sStack_156;
          local_f8 = auVar47;
        }
        else {
          piVar2 = matrix->matrix;
          Var12 = CONCAT28(local_158,CONCAT26(sStack_156,CONCAT24(local_158,uVar72)));
          auVar11._10_2_ = sStack_156;
          auVar11._0_10_ = Var12;
          auVar11._12_2_ = local_158;
          auVar11._14_2_ = sStack_156;
          uVar39 = 1;
          if (1 < (int)uVar15) {
            uVar39 = (ulong)uVar15;
          }
          lVar20 = uVar43 * 0x20;
          local_100 = uVar43 * 4 + -4;
          local_110 = uVar43 * 0x1c + -0x1c;
          local_118 = uVar43 * 0x18 + -0x18;
          local_120 = uVar43 * 0x14 + -0x14;
          local_128 = uVar43 * 8 + -8;
          local_130 = uVar43 * 0x10 + -0x10;
          local_138 = uVar43 * 0xc + -0xc;
          local_108 = 0;
          uVar28 = 0;
          auVar47 = auVar11;
          auVar60 = _DAT_008d09b0;
          local_f8 = auVar11;
          do {
            iVar18 = matrix->type;
            uVar15 = (uint)uVar28;
            uVar16 = uVar15;
            if (iVar18 == 0) {
              uVar16 = (uint)local_1a0[uVar28];
            }
            uVar21 = uVar28 | 1;
            if (iVar18 == 0) {
              uVar22 = (int)local_1a0[uVar21];
            }
            else {
              uVar22 = uVar33;
              if (uVar21 < uVar42) {
                uVar22 = uVar15 | 1;
              }
            }
            uVar34 = uVar28 | 2;
            if (iVar18 == 0) {
              uVar23 = (int)local_1a0[uVar34];
            }
            else {
              uVar23 = uVar33;
              if (uVar34 < uVar42) {
                uVar23 = uVar15 | 2;
              }
            }
            uVar35 = uVar28 | 3;
            if (iVar18 == 0) {
              uVar24 = (int)local_1a0[uVar35];
            }
            else {
              uVar24 = uVar33;
              if (uVar35 < uVar42) {
                uVar24 = uVar15 | 3;
              }
            }
            uVar40 = uVar28 | 4;
            if (iVar18 == 0) {
              uVar25 = (int)local_1a0[uVar40];
            }
            else {
              uVar25 = uVar33;
              if (uVar40 < uVar42) {
                uVar25 = uVar15 | 4;
              }
            }
            uVar36 = uVar28 | 5;
            if (iVar18 == 0) {
              uVar26 = (int)local_1a0[uVar36];
            }
            else {
              uVar26 = uVar33;
              if (uVar36 < uVar42) {
                uVar26 = uVar15 | 5;
              }
            }
            uVar37 = uVar28 | 6;
            if (iVar18 == 0) {
              uVar17 = (int)local_1a0[uVar37];
            }
            else {
              uVar17 = uVar33;
              if (uVar37 < uVar42) {
                uVar17 = uVar15 | 6;
              }
            }
            iVar32 = matrix->size;
            uVar29 = uVar28 | 7;
            if (iVar18 == 0) {
              uVar31 = (int)local_1a0[uVar29];
            }
            else {
              uVar31 = uVar33;
              if (uVar29 < uVar42) {
                uVar31 = uVar15 | 7;
              }
            }
            uVar1 = uVar28 + 8;
            local_98 = (undefined8)((unkuint10)Var12 >> 0x10);
            uStack_90 = auVar11._8_8_ >> 0x10;
            auVar61._8_8_ = uStack_90 | (ulong)(ushort)ptr_00[6] << 0x30;
            auVar61._0_8_ = local_98;
            ptr_00[6] = sVar63 - (short)uVar1 * (short)gap;
            auVar80._8_8_ = uStack_90 | (ulong)(ushort)(sVar63 - (short)uVar28 * (short)gap) << 0x30
            ;
            auVar80._0_8_ = local_98;
            local_88 = auVar59._0_2_;
            sStack_86 = auVar59._2_2_;
            sStack_84 = auVar59._4_2_;
            sStack_82 = auVar59._6_2_;
            sStack_80 = auVar59._8_2_;
            sStack_7e = auVar59._10_2_;
            sStack_7c = auVar59._12_2_;
            sStack_7a = auVar59._14_2_;
            auVar78._0_2_ = -(ushort)(auVar60._0_2_ == local_88);
            auVar78._2_2_ = -(ushort)(auVar60._2_2_ == sStack_86);
            auVar78._4_2_ = -(ushort)(auVar60._4_2_ == sStack_84);
            auVar78._6_2_ = -(ushort)(auVar60._6_2_ == sStack_82);
            auVar78._8_2_ = -(ushort)(auVar60._8_2_ == sStack_80);
            auVar78._10_2_ = -(ushort)(auVar60._10_2_ == sStack_7e);
            auVar78._12_2_ = -(ushort)(auVar60._12_2_ == sStack_7c);
            auVar78._14_2_ = -(ushort)(auVar60._14_2_ == sStack_7a);
            uVar28 = 0;
            auVar50._4_2_ = local_158;
            auVar50._0_4_ = uVar72;
            auVar50._6_2_ = sStack_156;
            auVar50._8_2_ = local_158;
            auVar50._10_2_ = sStack_156;
            auVar50._12_2_ = local_158;
            auVar50._14_2_ = sStack_156;
            auVar79 = _DAT_008d0b70;
            auVar83 = auVar50;
            do {
              auVar82._14_2_ = (short)piVar2[(long)(int)(uVar16 * iVar32) + (long)ptr[uVar28 + 7]];
              auVar82._12_2_ = (short)piVar2[(long)(int)(uVar22 * iVar32) + (long)ptr[uVar28 + 6]];
              auVar82._10_2_ = (short)piVar2[(long)(int)(uVar23 * iVar32) + (long)ptr[uVar28 + 5]];
              auVar82._8_2_ = (short)piVar2[(long)(int)(uVar24 * iVar32) + (long)ptr[uVar28 + 4]];
              auVar82._6_2_ = (short)piVar2[(long)(int)(uVar25 * iVar32) + (long)ptr[uVar28 + 3]];
              auVar82._4_2_ = (short)piVar2[(long)(int)(uVar26 * iVar32) + (long)ptr[uVar28 + 2]];
              auVar82._0_2_ = (undefined2)piVar2[(long)(int)(uVar31 * iVar32) + (long)ptr[uVar28]];
              auVar82._2_2_ = (short)piVar2[(long)(int)(uVar17 * iVar32) + (long)ptr[uVar28 + 1]];
              auVar77._0_8_ = auVar80._2_8_;
              auVar77._8_8_ = auVar80._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar28 + 7] << 0x30;
              auVar61 = paddsw(auVar82,auVar61);
              auVar81._0_8_ = auVar50._2_8_;
              auVar81._8_8_ = auVar50._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar28 + 7] << 0x30;
              auVar14._4_4_ = uVar45;
              auVar14._0_4_ = uVar45;
              auVar14._8_4_ = uVar45;
              auVar14._12_4_ = uVar45;
              auVar50 = psubsw(auVar77,auVar14);
              auVar82 = psubsw(auVar81,auVar48);
              sVar4 = auVar50._0_2_;
              sVar74 = auVar82._0_2_;
              auVar85._0_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._2_2_;
              sVar74 = auVar82._2_2_;
              auVar85._2_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._4_2_;
              sVar74 = auVar82._4_2_;
              auVar85._4_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._6_2_;
              sVar74 = auVar82._6_2_;
              auVar85._6_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._8_2_;
              sVar74 = auVar82._8_2_;
              auVar85._8_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._10_2_;
              sVar74 = auVar82._10_2_;
              auVar85._10_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74
              ;
              sVar4 = auVar50._12_2_;
              sVar74 = auVar82._12_2_;
              sVar76 = auVar82._14_2_;
              auVar85._12_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74
              ;
              sVar4 = auVar50._14_2_;
              auVar85._14_2_ = (ushort)(sVar76 < sVar4) * sVar4 | (ushort)(sVar76 >= sVar4) * sVar76
              ;
              auVar50 = psubsw(auVar80,auVar14);
              auVar83 = psubsw(auVar83,auVar48);
              sVar4 = auVar50._0_2_;
              sVar74 = auVar83._0_2_;
              auVar75._0_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._2_2_;
              sVar74 = auVar83._2_2_;
              auVar75._2_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._4_2_;
              sVar74 = auVar83._4_2_;
              auVar75._4_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._6_2_;
              sVar74 = auVar83._6_2_;
              auVar75._6_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._8_2_;
              sVar74 = auVar83._8_2_;
              auVar75._8_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74;
              sVar4 = auVar50._10_2_;
              sVar74 = auVar83._10_2_;
              auVar75._10_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74
              ;
              sVar4 = auVar50._12_2_;
              sVar74 = auVar83._12_2_;
              sVar76 = auVar83._14_2_;
              auVar75._12_2_ = (ushort)(sVar74 < sVar4) * sVar4 | (ushort)(sVar74 >= sVar4) * sVar74
              ;
              sVar4 = auVar50._14_2_;
              auVar75._14_2_ = (ushort)(sVar76 < sVar4) * sVar4 | (ushort)(sVar76 >= sVar4) * sVar76
              ;
              uVar44 = ((short)auVar75._0_2_ < (short)auVar85._0_2_) * auVar85._0_2_ |
                       ((short)auVar75._0_2_ >= (short)auVar85._0_2_) * auVar75._0_2_;
              uVar52 = ((short)auVar75._2_2_ < (short)auVar85._2_2_) * auVar85._2_2_ |
                       ((short)auVar75._2_2_ >= (short)auVar85._2_2_) * auVar75._2_2_;
              uVar53 = ((short)auVar75._4_2_ < (short)auVar85._4_2_) * auVar85._4_2_ |
                       ((short)auVar75._4_2_ >= (short)auVar85._4_2_) * auVar75._4_2_;
              uVar54 = ((short)auVar75._6_2_ < (short)auVar85._6_2_) * auVar85._6_2_ |
                       ((short)auVar75._6_2_ >= (short)auVar85._6_2_) * auVar75._6_2_;
              uVar55 = ((short)auVar75._8_2_ < (short)auVar85._8_2_) * auVar85._8_2_ |
                       ((short)auVar75._8_2_ >= (short)auVar85._8_2_) * auVar75._8_2_;
              uVar56 = ((short)auVar75._10_2_ < (short)auVar85._10_2_) * auVar85._10_2_ |
                       ((short)auVar75._10_2_ >= (short)auVar85._10_2_) * auVar75._10_2_;
              uVar57 = ((short)auVar75._12_2_ < (short)auVar85._12_2_) * auVar85._12_2_ |
                       ((short)auVar75._12_2_ >= (short)auVar85._12_2_) * auVar75._12_2_;
              uVar58 = ((short)auVar75._14_2_ < (short)auVar85._14_2_) * auVar85._14_2_ |
                       ((short)auVar75._14_2_ >= (short)auVar85._14_2_) * auVar75._14_2_;
              sVar4 = auVar61._0_2_;
              auVar83._0_2_ =
                   (ushort)((short)uVar44 < sVar4) * sVar4 | ((short)uVar44 >= sVar4) * uVar44;
              sVar4 = auVar61._2_2_;
              auVar83._2_2_ =
                   (ushort)((short)uVar52 < sVar4) * sVar4 | ((short)uVar52 >= sVar4) * uVar52;
              sVar4 = auVar61._4_2_;
              auVar83._4_2_ =
                   (ushort)((short)uVar53 < sVar4) * sVar4 | ((short)uVar53 >= sVar4) * uVar53;
              sVar4 = auVar61._6_2_;
              auVar83._6_2_ =
                   (ushort)((short)uVar54 < sVar4) * sVar4 | ((short)uVar54 >= sVar4) * uVar54;
              sVar4 = auVar61._8_2_;
              auVar83._8_2_ =
                   (ushort)((short)uVar55 < sVar4) * sVar4 | ((short)uVar55 >= sVar4) * uVar55;
              sVar4 = auVar61._10_2_;
              auVar83._10_2_ =
                   (ushort)((short)uVar56 < sVar4) * sVar4 | ((short)uVar56 >= sVar4) * uVar56;
              sVar4 = auVar61._12_2_;
              auVar83._12_2_ =
                   (ushort)((short)uVar57 < sVar4) * sVar4 | ((short)uVar57 >= sVar4) * uVar57;
              sVar4 = auVar61._14_2_;
              auVar83._14_2_ =
                   (ushort)((short)uVar58 < sVar4) * sVar4 | ((short)uVar58 >= sVar4) * uVar58;
              auVar84._0_2_ = -(ushort)(auVar79._0_2_ == -1);
              auVar84._2_2_ = -(ushort)(auVar79._2_2_ == -1);
              auVar84._4_2_ = -(ushort)(auVar79._4_2_ == -1);
              auVar84._6_2_ = -(ushort)(auVar79._6_2_ == -1);
              auVar84._8_2_ = -(ushort)(auVar79._8_2_ == -1);
              auVar84._10_2_ = -(ushort)(auVar79._10_2_ == -1);
              auVar84._12_2_ = -(ushort)(auVar79._12_2_ == -1);
              auVar84._14_2_ = -(ushort)(auVar79._14_2_ == -1);
              auVar80 = local_148 & auVar84 | ~auVar84 & auVar83;
              sVar4 = auVar80._0_2_;
              sVar74 = auVar80._2_2_;
              sVar76 = auVar80._4_2_;
              sVar5 = auVar80._6_2_;
              sVar6 = auVar80._8_2_;
              sVar7 = auVar80._10_2_;
              sVar8 = auVar80._12_2_;
              sVar9 = auVar80._14_2_;
              if (7 < uVar28) {
                uVar64 = (ushort)(sVar4 < (short)uVar64) * sVar4 | (sVar4 >= (short)uVar64) * uVar64
                ;
                uVar65 = (ushort)(sVar74 < (short)uVar65) * sVar74 |
                         (sVar74 >= (short)uVar65) * uVar65;
                uVar66 = (ushort)(sVar76 < (short)uVar66) * sVar76 |
                         (sVar76 >= (short)uVar66) * uVar66;
                uVar67 = (ushort)(sVar5 < (short)uVar67) * sVar5 | (sVar5 >= (short)uVar67) * uVar67
                ;
                uVar68 = (ushort)(sVar6 < (short)uVar68) * sVar6 | (sVar6 >= (short)uVar68) * uVar68
                ;
                uVar69 = (ushort)(sVar7 < (short)uVar69) * sVar7 | (sVar7 >= (short)uVar69) * uVar69
                ;
                uVar70 = (ushort)(sVar8 < (short)uVar70) * sVar8 | (sVar8 >= (short)uVar70) * uVar70
                ;
                uVar71 = (ushort)(sVar9 < (short)uVar71) * sVar9 | (sVar9 >= (short)uVar71) * uVar71
                ;
                local_f8._2_2_ =
                     (ushort)((short)local_f8._2_2_ < sVar74) * sVar74 |
                     (ushort)((short)local_f8._2_2_ >= sVar74) * local_f8._2_2_;
                local_f8._0_2_ =
                     (ushort)((short)local_f8._0_2_ < sVar4) * sVar4 |
                     (ushort)((short)local_f8._0_2_ >= sVar4) * local_f8._0_2_;
                local_f8._4_2_ =
                     (ushort)((short)local_f8._4_2_ < sVar76) * sVar76 |
                     (ushort)((short)local_f8._4_2_ >= sVar76) * local_f8._4_2_;
                local_f8._6_2_ =
                     (ushort)((short)local_f8._6_2_ < sVar5) * sVar5 |
                     (ushort)((short)local_f8._6_2_ >= sVar5) * local_f8._6_2_;
                local_f8._8_2_ =
                     (ushort)((short)local_f8._8_2_ < sVar6) * sVar6 |
                     (ushort)((short)local_f8._8_2_ >= sVar6) * local_f8._8_2_;
                local_f8._10_2_ =
                     (ushort)((short)local_f8._10_2_ < sVar7) * sVar7 |
                     (ushort)((short)local_f8._10_2_ >= sVar7) * local_f8._10_2_;
                local_f8._12_2_ =
                     (ushort)((short)local_f8._12_2_ < sVar8) * sVar8 |
                     (ushort)((short)local_f8._12_2_ >= sVar8) * local_f8._12_2_;
                local_f8._14_2_ =
                     (ushort)((short)local_f8._14_2_ < sVar9) * sVar9 |
                     (ushort)((short)local_f8._14_2_ >= sVar9) * local_f8._14_2_;
              }
              piVar3 = ((ppVar19->field_4).rowcols)->score_row;
              if (uVar28 < uVar43) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_108) = (int)sVar9;
              }
              if (uVar28 - 1 < uVar43 && uVar21 < uVar42) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_100) = (int)sVar8;
              }
              if ((uVar34 < uVar42) && ((long)(uVar28 - 2) < (long)uVar43 && 1 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_128) = (int)sVar7;
              }
              if ((uVar35 < uVar42) && ((long)(uVar28 - 3) < (long)uVar43 && 2 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_138) = (int)sVar6;
              }
              if ((uVar40 < uVar42) && ((long)(uVar28 - 4) < (long)uVar43 && 3 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_130) = (int)sVar5;
              }
              if ((uVar36 < uVar42) && ((long)(uVar28 - 5) < (long)uVar43 && 4 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_120) = (int)sVar76;
              }
              if ((uVar37 < uVar42) && ((long)(uVar28 - 6) < (long)uVar43 && 5 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_118) = (int)sVar74;
              }
              if ((uVar29 < uVar42) && ((long)(uVar28 - 7) < (long)uVar43 && 6 < uVar28)) {
                *(int *)((long)piVar3 + uVar28 * 4 + local_110) = (int)sVar4;
              }
              auVar13._4_2_ = local_158;
              auVar13._0_4_ = uVar72;
              auVar13._6_2_ = sStack_156;
              auVar13._8_2_ = local_158;
              auVar13._10_2_ = sStack_156;
              auVar13._12_2_ = local_158;
              auVar13._14_2_ = sStack_156;
              auVar50 = ~auVar84 & auVar85 | auVar13 & auVar84;
              auVar83 = ~auVar84 & auVar75 | auVar13 & auVar84;
              ptr_00[uVar28] = sVar4;
              ptr_01[uVar28] = auVar50._0_2_;
              local_68 = auVar49._0_2_;
              sStack_66 = auVar49._2_2_;
              sStack_64 = auVar49._4_2_;
              sStack_62 = auVar49._6_2_;
              sStack_60 = auVar49._8_2_;
              sStack_5e = auVar49._10_2_;
              sStack_5c = auVar49._12_2_;
              sStack_5a = auVar49._14_2_;
              auVar51._0_2_ = -(ushort)(auVar79._0_2_ == local_68);
              auVar51._2_2_ = -(ushort)(auVar79._2_2_ == sStack_66);
              auVar51._4_2_ = -(ushort)(auVar79._4_2_ == sStack_64);
              auVar51._6_2_ = -(ushort)(auVar79._6_2_ == sStack_62);
              auVar51._8_2_ = -(ushort)(auVar79._8_2_ == sStack_60);
              auVar51._10_2_ = -(ushort)(auVar79._10_2_ == sStack_5e);
              auVar51._12_2_ = -(ushort)(auVar79._12_2_ == sStack_5c);
              auVar51._14_2_ = -(ushort)(auVar79._14_2_ == sStack_5a);
              auVar47 = ~(auVar51 & auVar78) & auVar47 | auVar80 & auVar51 & auVar78;
              auVar79 = paddsw(auVar79,_DAT_008d0b80);
              uVar28 = uVar28 + 1;
              auVar61 = auVar77;
            } while (uVar39 != uVar28);
            auVar60 = paddsw(auVar60,_DAT_008d0b90);
            local_148 = psubsw(local_148,auVar73);
            local_108 = local_108 + lVar20;
            local_100 = local_100 + lVar20;
            local_110 = local_110 + lVar20;
            local_118 = local_118 + lVar20;
            local_120 = local_120 + lVar20;
            local_130 = local_130 + lVar20;
            local_138 = local_138 + lVar20;
            local_128 = local_128 + lVar20;
            uVar28 = uVar1;
          } while (uVar1 < uVar42);
        }
        iVar18 = 8;
        do {
          uVar42 = auVar47._0_8_;
          lVar20 = auVar47._8_8_;
          uVar16 = (uint)auVar47._14_2_;
          if ((short)auVar47._14_2_ <= (short)uVar38) {
            uVar16 = uVar38;
          }
          uVar38 = uVar16;
          sVar63 = (short)uVar38;
          auVar47._0_8_ = uVar42 << 0x10;
          auVar47._8_8_ = lVar20 << 0x10 | uVar42 >> 0x30;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        auVar79._0_2_ = -(ushort)((short)uVar64 < local_158);
        auVar79._2_2_ = -(ushort)((short)uVar65 < sStack_156);
        auVar79._4_2_ = -(ushort)((short)uVar66 < local_158);
        auVar79._6_2_ = -(ushort)((short)uVar67 < sStack_156);
        auVar79._8_2_ = -(ushort)((short)uVar68 < local_158);
        auVar79._10_2_ = -(ushort)((short)uVar69 < sStack_156);
        auVar79._12_2_ = -(ushort)((short)uVar70 < local_158);
        auVar79._14_2_ = -(ushort)((short)uVar71 < sStack_156);
        auVar62._0_2_ = -(ushort)((short)local_e8 < (short)local_f8._0_2_);
        auVar62._2_2_ = -(ushort)((short)uStack_e6 < (short)local_f8._2_2_);
        auVar62._4_2_ = -(ushort)((short)local_e8 < (short)local_f8._4_2_);
        auVar62._6_2_ = -(ushort)((short)uStack_e6 < (short)local_f8._6_2_);
        auVar62._8_2_ = -(ushort)((short)local_e8 < (short)local_f8._8_2_);
        auVar62._10_2_ = -(ushort)((short)uStack_e6 < (short)local_f8._10_2_);
        auVar62._12_2_ = -(ushort)((short)local_e8 < (short)local_f8._12_2_);
        auVar62._14_2_ = -(ushort)((short)uStack_e6 < (short)local_f8._14_2_);
        auVar62 = auVar62 | auVar79;
        if ((((((((((((((((auVar62 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar62 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar62 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar62 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar62 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar62 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar62 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar62 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar62[0xf] < '\0') {
          *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
          sVar63 = 0;
          iVar27 = 0;
          uVar33 = 0;
        }
        ppVar19->score = (int)sVar63;
        ppVar19->end_query = uVar33;
        ppVar19->end_ref = iVar27;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_1a0);
          return ppVar19;
        }
        return ppVar19;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}